

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType colortype;
  byte g_00;
  byte bVar1;
  uchar a_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong in_R10;
  undefined7 uVar7;
  ulong in_R11;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  unsigned_short g;
  unsigned_short b;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  undefined2 local_122;
  undefined2 local_120;
  undefined2 local_11e;
  undefined2 local_11c;
  byte local_119;
  LodePNGColorStats *local_118;
  uint local_110;
  byte local_10c;
  uchar local_10b;
  byte local_10a;
  byte local_109;
  size_t local_108;
  uint local_fc;
  LodePNGColorMode *local_f8;
  uchar *local_f0;
  uint local_e4;
  ulong local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_108 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_f0 = in;
  uVar2 = lodepng_can_have_alpha(mode_in);
  uVar4 = mode_in->bitdepth;
  local_f8 = mode_in;
  uVar3 = getNumColorChannels(colortype);
  uVar3 = uVar3 * uVar4;
  uVar6 = stats->bits;
  bVar11 = uVar3 == 1 && uVar6 == 1;
  uVar9 = stats->numcolors;
  local_d4 = 0x101;
  if ((uVar3 < 9) && (local_d4 = (1 << ((byte)uVar3 & 0x1f)) + uVar9, 0x100 < local_d4)) {
    local_d4 = 0x101;
  }
  stats->numpixels = stats->numpixels + local_108;
  bVar12 = stats->allow_palette == 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  local_110 = 1;
  if (stats->alpha == 0) {
    local_110 = uVar2 ^ 1;
  }
  uVar2 = stats->colored;
  local_119 = uVar3 <= uVar6;
  bVar13 = (uVar6 == 0x10 || bVar12) || local_d4 <= uVar9;
  uVar10 = (ulong)uVar9;
  if ((uVar6 != 0x10 && !bVar12) && local_d4 > uVar9) {
    if (uVar9 == 0) {
      local_e0 = 0;
      uVar10 = local_e0;
    }
    else {
      local_118 = (LodePNGColorStats *)CONCAT71(local_118._1_7_,bVar11);
      uVar10 = 0;
      local_fc = uVar3;
      do {
        uVar6 = color_tree_add((ColorTree *)local_b8,stats->palette[uVar10 * 4],
                               stats->palette[uVar10 * 4 + 1],stats->palette[uVar10 * 4 + 2],
                               stats->palette[uVar10 * 4 + 3],(uint)uVar10);
        if (uVar6 != 0) goto LAB_0011fd7d;
        uVar10 = uVar10 + 1;
      } while (uVar10 < stats->numcolors);
      uVar4 = local_f8->bitdepth;
      uVar3 = local_fc;
      uVar10 = (ulong)stats->numcolors;
      bVar11 = (byte)local_118;
    }
  }
  local_e0 = uVar10;
  uVar6 = (uint)((colortype & ~LCT_GREY_ALPHA) == LCT_GREY || uVar2 != 0);
  local_118 = stats;
  if (uVar4 == 0x10) {
    local_11e = 0;
    local_122 = 0;
    local_120 = 0;
    local_11c = 0;
    if (local_108 != 0) {
      sVar8 = 0;
      do {
        getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar8,local_f8);
        if (((((local_11e & 0xff) != local_11e >> 8) || ((local_122 & 0xff) != local_122 >> 8)) ||
            ((local_120 & 0xff) != local_120 >> 8)) || ((local_11c & 0xff) != local_11c >> 8)) {
          stats->bits = 0x10;
          sVar8 = 0;
          local_11e = 0;
          local_122 = 0;
          local_120 = 0;
          local_11c = 0;
          uVar9 = local_110;
          goto LAB_0011fdd9;
        }
        sVar8 = sVar8 + 1;
      } while (local_108 != sVar8);
    }
  }
  local_11e = (ushort)local_11e._1_1_ << 8;
  local_122 = (ushort)local_122._1_1_ << 8;
  local_120 = (ushort)local_120._1_1_ << 8;
  local_11c = (ushort)local_11c._1_1_ << 8;
  if (local_108 != 0) {
    local_119 = local_119 | bVar11;
    sVar8 = 0;
    local_fc = uVar3;
    do {
      getPixelColorRGBA8((uchar *)&local_11e,(uchar *)&local_122,(uchar *)&local_120,
                         (uchar *)&local_11c,local_f0,sVar8,local_f8);
      uVar9 = stats->bits;
      bVar11 = (byte)local_11e;
      if (uVar9 < 8 && (local_119 & 1) == 0) {
        uVar4 = 1;
        if ((1 < (byte)((byte)local_11e + 1)) && (uVar4 = 8, (byte)((byte)local_11e * -0xf) < 0x10))
        {
          uVar4 = (uint)(3 < (byte)((byte)local_11e * -3)) * 2 + 2;
        }
        if (uVar9 < uVar4) {
          stats->bits = uVar4;
          uVar9 = uVar4;
        }
      }
      local_119 = uVar3 <= uVar9;
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      in_R10 = CONCAT71((int7)(in_R10 >> 8),1);
      uVar2 = 1;
      g_00 = (byte)local_122;
      bVar1 = (byte)local_120;
      uVar4 = uVar9;
      if (uVar6 == 0) {
        if ((byte)local_11e == (byte)local_122) {
          in_R10 = 0;
          uVar2 = 0;
          if ((byte)local_11e == (byte)local_120) goto LAB_0011fa00;
        }
        stats->colored = 1;
        uVar7 = (undefined7)(in_R10 >> 8);
        in_R10 = CONCAT71(uVar7,1);
        uVar2 = 1;
        if (uVar9 < 8) {
          stats->bits = 8;
          uVar4 = 8;
          in_R10 = CONCAT71(uVar7,1);
        }
      }
LAB_0011fa00:
      a_00 = (uchar)local_11c;
      if (local_110 == 0) {
        if ((stats->key_r == (local_11e & 0xff)) && (stats->key_g == (local_122 & 0xff))) {
          bVar12 = stats->key_b == (local_120 & 0xff);
        }
        else {
          bVar12 = false;
        }
        if ((uchar)local_11c == 0xff) {
          in_R11 = 0;
          local_110 = 0;
          if ((bool)(stats->key != 0 & bVar12)) {
            stats->alpha = 1;
            stats->key = 0;
            if (uVar4 < 8) goto LAB_0011fc6d;
            goto LAB_0011fa07;
          }
        }
        else {
          if (((uchar)local_11c != '\0') || (!(bool)(stats->key == 0 | bVar12))) {
            stats->alpha = 1;
            stats->key = 0;
            if (uVar4 < 8) {
LAB_0011fc6d:
              stats->bits = 8;
              goto LAB_0011fa07;
            }
            goto LAB_0011fa0a;
          }
          in_R11 = 0;
          local_110 = 0;
          if (stats->key == 0 && stats->alpha == 0) {
            stats->key = 1;
            stats->key_r = local_11e & 0xff;
            stats->key_g = local_122 & 0xff;
            stats->key_b = local_120 & 0xff;
            in_R11 = 0;
            local_110 = 0;
          }
        }
      }
      else {
LAB_0011fa07:
        in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
LAB_0011fa0a:
        local_110 = 1;
      }
      bVar12 = true;
      if (bVar13) {
LAB_0011fa1b:
        bVar13 = bVar12;
        bVar11 = (byte)in_R11 & bVar13;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar11);
        bVar11 = (byte)in_R10 & bVar11;
        in_R10 = CONCAT71((int7)(in_R10 >> 8),bVar11);
        uVar6 = uVar2;
        if ((bVar11 == 1) && (uVar3 <= uVar9)) break;
      }
      else {
        local_d0 = (uint)in_R11;
        local_cc = (uint)in_R10;
        local_109 = (byte)local_122;
        local_c4 = (uint)(byte)local_120;
        local_e4 = uVar2;
        local_c8 = uVar9;
        local_c0 = sVar8;
        iVar5 = color_tree_get((ColorTree *)local_b8,(byte)local_11e,(byte)local_122,(byte)local_120
                               ,(uchar)local_11c);
        bVar13 = false;
        sVar8 = local_c0;
        stats = local_118;
        uVar3 = local_fc;
        uVar6 = local_e4;
        if (iVar5 < 0) {
          local_10c = bVar11;
          local_10b = a_00;
          local_10a = bVar1;
          uVar6 = color_tree_add((ColorTree *)local_b8,bVar11,g_00,(uchar)local_c4,a_00,
                                 (uint)local_e0);
          if (uVar6 == 0) {
            uVar6 = local_118->numcolors;
            if ((ulong)uVar6 < 0x100) {
              uVar10 = (ulong)(uVar6 * 4);
              local_118->palette[(ulong)uVar6 * 4] = local_10c;
              local_118->palette[uVar10 + 1] = local_109;
              local_118->palette[uVar10 + 2] = local_10a;
              local_118->palette[uVar10 + 3] = local_10b;
            }
            uVar6 = uVar6 + 1;
            local_e0 = (ulong)uVar6;
            local_118->numcolors = uVar6;
            in_R10 = (ulong)local_cc;
            in_R11 = (ulong)local_d0;
            sVar8 = local_c0;
            stats = local_118;
            uVar3 = local_fc;
            uVar9 = local_c8;
            uVar2 = local_e4;
            bVar12 = local_d4 <= uVar6;
            goto LAB_0011fa1b;
          }
          goto LAB_0011fd7d;
        }
      }
      sVar8 = sVar8 + 1;
    } while (local_108 != sVar8);
  }
  if ((stats->key != 0) && (local_118->alpha == 0 && local_108 != 0)) {
    sVar8 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_11e,(uchar *)&local_122,(uchar *)&local_120,
                         (uchar *)&local_11c,local_f0,sVar8,local_f8);
      if (((((uchar)local_11c != '\0') && (local_118->key_r == (local_11e & 0xff))) &&
          (local_118->key_g == (local_122 & 0xff))) && (local_118->key_b == (local_120 & 0xff))) {
        local_118->alpha = 1;
        local_118->key = 0;
        if (local_118->bits < 8) {
          local_118->bits = 8;
        }
      }
      sVar8 = sVar8 + 1;
    } while (local_108 != sVar8);
  }
  uVar10._0_2_ = local_118->key_r;
  uVar10._2_2_ = local_118->key_g;
  uVar10._4_2_ = local_118->key_b;
  uVar10._6_2_ = *(undefined2 *)&local_118->field_0xe;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar10;
  auVar14 = psllw(auVar14,8);
  local_118->key_r = auVar14._0_2_ + (undefined2)uVar10;
  local_118->key_g = auVar14._2_2_ + uVar10._2_2_;
  local_118->key_b = (short)(*(int *)&local_118->key_b << 8) + (short)*(int *)&local_118->key_b;
LAB_0011fd7a:
  uVar6 = 0;
LAB_0011fd7d:
  color_tree_cleanup((ColorTree *)local_b8);
  return uVar6;
  while (sVar8 = sVar8 + 1, local_108 != sVar8) {
LAB_0011fdd9:
    getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar8,local_f8);
    bVar12 = true;
    bVar13 = uVar6 == 0;
    uVar6 = 1;
    if (bVar13) {
      if (local_11e == local_122) {
        bVar12 = false;
        uVar6 = 0;
        if (local_11e == local_120) goto LAB_0011fe3c;
      }
      local_118->colored = 1;
      bVar12 = true;
      uVar6 = 1;
    }
LAB_0011fe3c:
    if (uVar9 == 0) {
      if ((local_11e == local_118->key_r) && (local_122 == local_118->key_g)) {
        bVar13 = local_120 == local_118->key_b;
      }
      else {
        bVar13 = false;
      }
      if (local_11c == 0xffff) {
        uVar9 = 0;
        if ((bool)(local_118->key != 0 & bVar13)) goto LAB_0011feda;
      }
      else {
        if ((local_11c != 0) || (!(bool)(local_118->key == 0 | bVar13))) {
LAB_0011feda:
          local_118->alpha = 1;
          local_118->key = 0;
          goto LAB_0011feed;
        }
        uVar9 = 0;
        if (local_118->key == 0 && local_118->alpha == 0) {
          local_118->key = 1;
          local_118->key_r = local_11e;
          local_118->key_g = local_122;
          local_118->key_b = local_120;
        }
      }
    }
    else {
LAB_0011feed:
      uVar9 = 1;
      if (bVar12) break;
    }
  }
  if ((local_118->key != 0) && (local_118->alpha == 0)) {
    sVar8 = 0;
    do {
      getPixelColorRGBA16(&local_11e,&local_122,&local_120,&local_11c,local_f0,sVar8,local_f8);
      if ((((local_11c != 0) && (local_11e == local_118->key_r)) && (local_122 == local_118->key_g))
         && (local_120 == local_118->key_b)) {
        local_118->alpha = 1;
        local_118->key = 0;
      }
      sVar8 = sVar8 + 1;
    } while (local_108 != sVar8);
  }
  goto LAB_0011fd7a;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}